

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcBlendEquationAdvancedTests.cpp
# Opt level: O2

Vec4 __thiscall glcts::BlendSoftLight(glcts *this,Vec4 *src,Vec4 *dst)

{
  float fVar1;
  float fVar2;
  Vec4 VVar3;
  Vec4 rgb;
  Vec4 local_28;
  
  fVar1 = SoftLight(src->m_data[0],dst->m_data[0]);
  fVar2 = SoftLight(src->m_data[1],dst->m_data[1]);
  local_28.m_data[2] = SoftLight(src->m_data[2],dst->m_data[2]);
  local_28.m_data[3] = 0.0;
  local_28.m_data[0] = fVar1;
  local_28.m_data[1] = fVar2;
  VVar3 = Blend(this,&local_28,src,dst);
  return (Vec4)VVar3.m_data;
}

Assistant:

static tcu::Vec4 BlendSoftLight(const tcu::Vec4& src, const tcu::Vec4& dst)
{
	tcu::Vec4 rgb(SoftLight(src[0], dst[0]), SoftLight(src[1], dst[1]), SoftLight(src[2], dst[2]), 0.f);

	return Blend(rgb, src, dst);
}